

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintJson(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  short sVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  reference pcVar11;
  undefined8 uVar12;
  undefined1 *puVar13;
  size_t sVar14;
  BamAlignment *in_RSI;
  long in_RDI;
  float fVar15;
  char type;
  size_t index;
  size_t tagDataLength;
  char *tagData;
  const_iterator s;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  const_iterator cigarBegin;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarData;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffd38;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  BadDataException *in_stack_fffffffffffffd50;
  undefined1 local_1c9 [71];
  undefined1 local_182;
  allocator local_181;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  ConvertToolPrivate *in_stack_fffffffffffffe90;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [35];
  undefined1 local_95;
  allocator local_81;
  string local_80 [32];
  ulong local_60;
  ulong local_58;
  long local_50;
  undefined8 local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  reference local_38;
  CigarOp *local_30;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_28;
  CigarOp *local_20;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_18;
  BamAlignment *local_10;
  
  local_10 = in_RSI;
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"{\"name\":\"");
  poVar6 = std::operator<<(poVar6,(string *)local_10);
  poVar6 = std::operator<<(poVar6,"\",\"alignmentFlag\":\"");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->AlignmentFlag);
  std::operator<<(poVar6,"\",");
  if ((-1 < local_10->RefID) &&
     (iVar4 = local_10->RefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), iVar4 < (int)sVar7)) {
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"reference\":\"");
    pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8),(long)local_10->RefID);
    poVar6 = std::operator<<(poVar6,(string *)pvVar8);
    std::operator<<(poVar6,"\",");
  }
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"position\":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->Position + 1);
  poVar6 = std::operator<<(poVar6,",\"mapQuality\":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->MapQuality);
  std::operator<<(poVar6,',');
  local_18 = &local_10->CigarData;
  bVar1 = std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::empty
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffffd50);
  if (!bVar1) {
    std::operator<<((ostream *)(in_RDI + 0x20),"\"cigar\":[");
    local_28._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   (in_stack_fffffffffffffd38);
    local_20 = local_28._M_current;
    local_30 = (CigarOp *)
               std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                         (in_stack_fffffffffffffd38);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffd40,
                              (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffffd38), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                 ::operator*(&local_28);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffd40,
                         (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                          *)in_stack_fffffffffffffd38);
      if (bVar1) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'\"');
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_38->Length);
      poVar6 = std::operator<<(poVar6,local_38->Type);
      std::operator<<(poVar6,'\"');
      __gnu_cxx::
      __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_28);
    }
    std::operator<<((ostream *)(in_RDI + 0x20),"],");
  }
  bVar1 = BamAlignment::IsPaired(local_10);
  if (((bVar1) && (-1 < local_10->MateRefID)) &&
     (iVar4 = local_10->MateRefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), iVar4 < (int)sVar7)) {
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"mate\":{");
    poVar6 = std::operator<<(poVar6,"\"reference\":\"");
    pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8),(long)local_10->MateRefID);
    poVar6 = std::operator<<(poVar6,(string *)pvVar8);
    poVar6 = std::operator<<(poVar6,"\",");
    poVar6 = std::operator<<(poVar6,"\"position\":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->MatePosition + 1);
    poVar6 = std::operator<<(poVar6,",\"insertSize\":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->InsertSize);
    std::operator<<(poVar6,"},");
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"queryBases\":\"");
    poVar6 = std::operator<<(poVar6,(string *)&local_10->QueryBases);
    std::operator<<(poVar6,"\",");
  }
  uVar9 = std::__cxx11::string::empty();
  if (((uVar9 & 1) == 0) &&
     (pcVar10 = (char *)std::__cxx11::string::at((ulong)&local_10->Qualities), *pcVar10 != -1)) {
    local_40._M_current = (char *)std::__cxx11::string::begin();
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"qualities\":[");
    pcVar11 = __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_40);
    std::ostream::operator<<(poVar6,(short)*pcVar11 + -0x21);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40);
    while( true ) {
      local_48 = std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffd40,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffd38);
      if (!bVar1) break;
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),',');
      pcVar11 = __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_40);
      std::ostream::operator<<(poVar6,(short)*pcVar11 + -0x21);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    std::operator<<((ostream *)(in_RDI + 0x20),"],");
  }
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"\"filename\":\"");
  poVar6 = std::operator<<(poVar6,(string *)&local_10->Filename);
  std::operator<<(poVar6,"\",");
  local_50 = std::__cxx11::string::c_str();
  local_58 = std::__cxx11::string::length();
  local_60 = 0;
  if (local_58 != 0) {
    std::operator<<((ostream *)(in_RDI + 0x20),"\"tags\":{");
    while (local_60 < local_58) {
      if (local_58 - local_60 < 4) {
        local_95 = 1;
        uVar12 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"Incomplete tag data",&local_81);
        BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        local_95 = 0;
        __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      if (local_60 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'\"');
      std::__cxx11::string::substr((ulong)local_b8,(ulong)&local_10->TagData);
      poVar6 = std::operator<<(poVar6,local_b8);
      std::operator<<(poVar6,"\":");
      std::__cxx11::string::~string(local_b8);
      local_60 = local_60 + 2;
      puVar13 = (undefined1 *)std::__cxx11::string::at((ulong)&local_10->TagData);
      local_b9 = *puVar13;
      local_60 = local_60 + 1;
      switch(local_b9) {
      case 0x41:
        poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'\"');
        poVar6 = std::operator<<(poVar6,*(char *)(local_50 + local_60));
        std::operator<<(poVar6,'\"');
        local_60 = local_60 + 1;
        break;
      case 0x42:
        std::operator<<((ostream *)(in_RDI + 0x20),'[');
        sVar14 = PrintBArrayValues(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                   in_stack_fffffffffffffe80);
        local_60 = sVar14 + local_60;
        std::operator<<((ostream *)(in_RDI + 0x20),']');
        break;
      case 0x43:
        std::ostream::operator<<((void *)(in_RDI + 0x20),(uint)*(byte *)(local_50 + local_60));
        local_60 = local_60 + 1;
        break;
      default:
        uVar12 = __cxa_allocate_exception(0x28);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1c9 + 1),"Unknown tag type: ",(allocator *)__lhs);
        std::operator+(__lhs,(char)((ulong)uVar12 >> 0x38));
        BadDataException::BadDataException(in_stack_fffffffffffffd50,__lhs);
        __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      case 0x48:
      case 0x5a:
        std::operator<<((ostream *)(in_RDI + 0x20),'\"');
        for (; *(char *)(local_50 + local_60) != '\0'; local_60 = local_60 + 1) {
          if (*(char *)(local_50 + local_60) == '\"') {
            std::operator<<((ostream *)(in_RDI + 0x20),"\\\"");
          }
          else {
            std::operator<<((ostream *)(in_RDI + 0x20),*(char *)(local_50 + local_60));
          }
        }
        std::operator<<((ostream *)(in_RDI + 0x20),'\"');
        local_60 = local_60 + 1;
        break;
      case 0x49:
        if (local_58 - local_60 < 4) {
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_158,"Incomplete tag data",&local_159);
          BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        uVar5 = UnpackUnsignedInt((char *)(local_50 + local_60));
        std::ostream::operator<<((void *)(in_RDI + 0x20),uVar5);
        local_60 = local_60 + 4;
        break;
      case 0x53:
        if (local_58 - local_60 < 2) {
          local_10a = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"Incomplete tag data",&local_109);
          BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          local_10a = 0;
          __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        uVar3 = UnpackUnsignedShort((char *)(local_50 + local_60));
        std::ostream::operator<<((void *)(in_RDI + 0x20),uVar3);
        local_60 = local_60 + 2;
        break;
      case 99:
        std::ostream::operator<<((void *)(in_RDI + 0x20),(int)*(char *)(local_50 + local_60));
        local_60 = local_60 + 1;
        break;
      case 0x66:
        if (local_58 - local_60 < 4) {
          local_182 = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffe80,"Incomplete tag data",&local_181);
          BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          local_182 = 0;
          __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        in_stack_fffffffffffffd50 = (BadDataException *)(in_RDI + 0x20);
        fVar15 = UnpackFloat((char *)(local_50 + local_60));
        std::ostream::operator<<(in_stack_fffffffffffffd50,fVar15);
        local_60 = local_60 + 4;
        break;
      case 0x69:
        if (local_58 - local_60 < 4) {
          local_132 = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,"Incomplete tag data",&local_131);
          BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          local_132 = 0;
          __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        iVar4 = UnpackSignedInt((char *)(local_50 + local_60));
        std::ostream::operator<<((void *)(in_RDI + 0x20),iVar4);
        local_60 = local_60 + 4;
        break;
      case 0x73:
        if (local_58 - local_60 < 2) {
          local_e2 = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,"Incomplete tag data",&local_e1);
          BadDataException::BadDataException(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          local_e2 = 0;
          __cxa_throw(uVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        sVar2 = UnpackSignedShort((char *)(local_50 + local_60));
        std::ostream::operator<<((void *)(in_RDI + 0x20),sVar2);
        local_60 = local_60 + 2;
      }
      if ((local_58 <= local_60) || (*(char *)(local_50 + local_60) == '\0')) break;
    }
    std::operator<<((ostream *)(in_RDI + 0x20),'}');
  }
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'}');
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintJson(const BamAlignment& a)
{

    // write name & alignment flag
    m_out << "{\"name\":\"" << a.Name << "\",\"alignmentFlag\":\"" << a.AlignmentFlag << "\",";

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << "\"reference\":\"" << m_references[a.RefID].RefName << "\",";
    }

    // write position & map quality
    m_out << "\"position\":" << a.Position + 1 << ",\"mapQuality\":" << a.MapQuality << ',';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "\"cigar\":[";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            if (cigarIter != cigarBegin) {
                m_out << ',';
            }
            m_out << '"' << op.Length << op.Type << '"';
        }
        m_out << "],";
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        m_out << "\"mate\":{"
              << "\"reference\":\"" << m_references[a.MateRefID].RefName << "\","
              << "\"position\":" << a.MatePosition + 1 << ",\"insertSize\":" << a.InsertSize
              << "},";
    }

    // write sequence
    if (!a.QueryBases.empty()) {
        m_out << "\"queryBases\":\"" << a.QueryBases << "\",";
    }

    // write qualities
    if (!a.Qualities.empty() && a.Qualities.at(0) != (char)0xFF) {
        std::string::const_iterator s = a.Qualities.begin();
        m_out << "\"qualities\":[" << static_cast<short>(*s) - 33;
        ++s;
        for (; s != a.Qualities.end(); ++s) {
            m_out << ',' << static_cast<short>(*s) - 33;
        }
        m_out << "],";
    }

    // write alignment's source BAM file
    m_out << "\"filename\":\"" << a.Filename << "\",";

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();
    std::size_t index = 0;
    if (index < tagDataLength) {

        m_out << "\"tags\":{";

        while (index < tagDataLength) {
            // Need at least four bytes for a tag:
            //    two for name
            //    one for type
            //    at least one for value
            if (tagDataLength - index < 4) {
                throw BadDataException("Incomplete tag data");
            }

            if (index > 0) {
                m_out << ',';
            }

            // write tag name
            m_out << '"' << a.TagData.substr(index, 2) << "\":";
            index += 2;

            // get data type
            char type = a.TagData.at(index);
            ++index;
            switch (type) {
                case (Constants::BAM_TAG_TYPE_ASCII):
                    m_out << '"' << tagData[index] << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<int8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_UINT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<uint8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT16):
                    if (tagDataLength - index < sizeof(int16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedShort(&tagData[index]);
                    index += sizeof(int16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT16):
                    if (tagDataLength - index < sizeof(uint16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
                    index += sizeof(uint16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_INT32):
                    if (tagDataLength - index < sizeof(int32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedInt(&tagData[index]);
                    index += sizeof(int32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT32):
                    if (tagDataLength - index < sizeof(uint32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
                    index += sizeof(uint32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_FLOAT):
                    if (tagDataLength - index < sizeof(float)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackFloat(&tagData[index]);
                    index += sizeof(float);
                    break;

                case (Constants::BAM_TAG_TYPE_HEX):
                case (Constants::BAM_TAG_TYPE_STRING):
                    m_out << '"';
                    while (tagData[index]) {
                        if (tagData[index] == '\"') {
                            m_out << "\\\"";  // escape for json
                        } else {
                            m_out << tagData[index];
                        }
                        ++index;
                    }
                    m_out << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_ARRAY):
                    m_out << '[';
                    index += PrintBArrayValues(tagData + index, tagDataLength - index);
                    m_out << ']';
                    break;

                default:
                    throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
            }

            if (index >= tagDataLength || tagData[index] == '\0') {
                break;
            }
        }

        m_out << '}';
    }

    m_out << '}' << std::endl;
}